

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O0

int64_t duckdb::SubtractDateParts<duckdb::date_t,duckdb::date_t,long>
                  (DatePartSpecifier type,date_t startdate,date_t enddate)

{
  NotImplementedException *this;
  undefined1 in_DIL;
  allocator local_a1;
  date_t in_stack_ffffffffffffff60;
  date_t in_stack_ffffffffffffff64;
  int64_t local_8;
  
  switch(in_DIL) {
  case 0:
  case 0xe:
    local_8 = DateSub::YearOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 1:
    local_8 = DateSub::MonthOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 2:
  case 0xb:
  case 0xc:
  case 0x10:
  case 0x17:
    local_8 = DateSub::DayOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 3:
    local_8 = DateSub::DecadeOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 4:
    local_8 = DateSub::CenturyOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 5:
    local_8 = DateSub::MilleniumOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 6:
    local_8 = DateSub::MicrosecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 7:
    local_8 = DateSub::MillisecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 8:
  case 0x16:
    local_8 = DateSub::SecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 9:
    local_8 = DateSub::MinutesOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 10:
    local_8 = DateSub::HoursOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 0xd:
  case 0x11:
    local_8 = DateSub::WeekOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  case 0xf:
    local_8 = DateSub::QuarterOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff60,"Specifier type not implemented for DATESUB",
               &local_a1);
    duckdb::NotImplementedException::NotImplementedException
              (this,(string *)&stack0xffffffffffffff60);
    __cxa_throw(this,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  }
  return local_8;
}

Assistant:

static int64_t SubtractDateParts(DatePartSpecifier type, TA startdate, TB enddate) {
	switch (type) {
	case DatePartSpecifier::YEAR:
	case DatePartSpecifier::ISOYEAR:
		return DateSub::YearOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::MONTH:
		return DateSub::MonthOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::DAY:
	case DatePartSpecifier::DOW:
	case DatePartSpecifier::ISODOW:
	case DatePartSpecifier::DOY:
	case DatePartSpecifier::JULIAN_DAY:
		return DateSub::DayOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::DECADE:
		return DateSub::DecadeOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::CENTURY:
		return DateSub::CenturyOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::MILLENNIUM:
		return DateSub::MilleniumOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::QUARTER:
		return DateSub::QuarterOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::WEEK:
	case DatePartSpecifier::YEARWEEK:
		return DateSub::WeekOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::MICROSECONDS:
		return DateSub::MicrosecondsOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::MILLISECONDS:
		return DateSub::MillisecondsOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::SECOND:
	case DatePartSpecifier::EPOCH:
		return DateSub::SecondsOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::MINUTE:
		return DateSub::MinutesOperator::template Operation<TA, TB, TR>(startdate, enddate);
	case DatePartSpecifier::HOUR:
		return DateSub::HoursOperator::template Operation<TA, TB, TR>(startdate, enddate);
	default:
		throw NotImplementedException("Specifier type not implemented for DATESUB");
	}
}